

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleBase::setupLeafNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values)

{
  bool bVar1;
  TreeEnsembleParameters_TreeNode *this_00;
  reference ppVar2;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_01;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *ei;
  pair<unsigned_long,_double> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *__range1;
  TreeNode *node;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *values_local;
  size_t nodeId_local;
  size_t treeId_local;
  TreeEnsembleBase *this_local;
  
  this_00 = _getNode(this,treeId,nodeId,true);
  Specification::TreeEnsembleParameters_TreeNode::set_nodebehavior
            (this_00,TreeEnsembleParameters_TreeNode_TreeNodeBehavior_LeafNode);
  Specification::TreeEnsembleParameters_TreeNode::clear_evaluationinfo(this_00);
  __end1 = std::
           vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           ::begin(values);
  p = (pair<unsigned_long,_double> *)
      std::
      vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
      end(values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
                                *)&p);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
             ::operator*(&__end1);
    this_01 = Specification::TreeEnsembleParameters_TreeNode::add_evaluationinfo(this_00);
    Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::set_evaluationindex
              (this_01,ppVar2->first);
    Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::set_evaluationvalue
              (this_01,ppVar2->second);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TreeEnsembleBase::setupLeafNode(size_t treeId, size_t nodeId,
                                         const std::vector<std::pair<size_t, double> >& values) {
        Specification::TreeEnsembleParameters::TreeNode& node = _getNode(treeId, nodeId, true);

        // TODO: Error checking routines -- make sure this node hasn't been requested before.
        node.set_nodebehavior(Specification::TreeEnsembleParameters::TreeNode::LeafNode);

        node.clear_evaluationinfo();
        for(const auto& p : values) {
            auto ei = node.add_evaluationinfo();
            ei->set_evaluationindex(p.first);
            ei->set_evaluationvalue(p.second);
        }
    }